

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O1

int flatcc_json_parser_table_as_root
              (flatcc_builder_t *B,flatcc_json_parser_t *ctx,char *buf,size_t bufsiz,
              flatcc_json_parser_flags_t flags,char *fid,flatcc_json_parser_table_f *parser)

{
  int iVar1;
  flatcc_builder_ref_t fVar2;
  int iVar3;
  char *pcVar4;
  flatcc_json_parser_t *pfVar5;
  flatcc_json_parser_t _ctx;
  flatcc_builder_ref_t local_7c;
  flatcc_json_parser_t local_78;
  
  pfVar5 = ctx;
  if (ctx == (flatcc_json_parser_t *)0x0) {
    pfVar5 = &local_78;
  }
  pfVar5->ctx = (flatcc_builder_t *)0x0;
  pfVar5->line_start = (char *)0x0;
  pfVar5->flags = 0;
  pfVar5->unquoted = 0;
  pfVar5->line = 0;
  pfVar5->pos = 0;
  *(undefined8 *)&pfVar5->error = 0;
  pfVar5->start = (char *)0x0;
  pfVar5->end = (char *)0x0;
  pfVar5->error_loc = (char *)0x0;
  pfVar5->end_loc = (char *)0x0;
  pfVar5->ctx = B;
  pfVar5->line_start = buf;
  pfVar5->line = 1;
  pfVar5->flags = flags;
  pfVar5->start = buf;
  pfVar5->end = buf + bufsiz;
  pfVar5->error_loc = buf;
  iVar1 = flatcc_builder_start_buffer(B,fid,0,(ushort)(flags >> 1) & 2);
  iVar3 = -1;
  if (iVar1 == 0) {
    pcVar4 = (*parser)(pfVar5,buf,buf + bufsiz,&local_7c);
    pfVar5 = ctx;
    if (ctx == (flatcc_json_parser_t *)0x0) {
      pfVar5 = &local_78;
    }
    iVar3 = pfVar5->error;
    if (iVar3 == 0) {
      fVar2 = flatcc_builder_end_buffer(B,local_7c);
      iVar3 = -1;
      if (fVar2 != 0) {
        pfVar5 = &local_78;
        if (ctx != (flatcc_json_parser_t *)0x0) {
          pfVar5 = ctx;
        }
        pfVar5->end_loc = pcVar4;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int flatcc_json_parser_table_as_root(flatcc_builder_t *B, flatcc_json_parser_t *ctx,
        const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags, const char *fid,
        flatcc_json_parser_table_f *parser)
{
    flatcc_json_parser_t _ctx;
    flatcc_builder_ref_t root;
    flatcc_builder_buffer_flags_t builder_flags = flags & flatcc_json_parser_f_with_size ? flatcc_builder_with_size : 0;

    ctx = ctx ? ctx : &_ctx;
    flatcc_json_parser_init(ctx, B, buf, buf + bufsiz, flags);
    if (flatcc_builder_start_buffer(B, fid, 0, builder_flags)) return -1;
    buf = parser(ctx, buf, buf + bufsiz, &root);
    if (ctx->error) {
        return ctx->error;
    }
    if (!flatcc_builder_end_buffer(B, root)) return -1;
    ctx->end_loc = buf;
    return 0;
}